

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomCustomWidget::read(DomCustomWidget *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  bool bVar1;
  int iVar2;
  DomHeader *this_00;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  undefined4 in_register_00000034;
  DomCustomWidget *size;
  long in_FS_OFFSET;
  DomPropertySpecifications *v_3;
  DomSlots *v_2;
  DomSize *v_1;
  DomHeader *v;
  QStringView tag;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  DomCustomWidget *in_stack_fffffffffffffc70;
  DomSlots *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  byte in_stack_fffffffffffffc87;
  DomSlots *in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc90;
  byte in_stack_fffffffffffffc91;
  byte in_stack_fffffffffffffc92;
  byte in_stack_fffffffffffffc93;
  byte in_stack_fffffffffffffc94;
  byte in_stack_fffffffffffffc95;
  byte in_stack_fffffffffffffc96;
  byte in_stack_fffffffffffffc97;
  DomSize *in_stack_fffffffffffffc98;
  char local_280 [72];
  char local_238 [72];
  undefined1 local_1f0 [64];
  char local_1b0 [72];
  undefined1 local_168 [64];
  undefined1 local_128 [144];
  undefined1 local_98 [64];
  undefined1 local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  size = (DomCustomWidget *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1aae80);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001ab7e0;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffc88,
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (QString *)in_stack_fffffffffffffc78);
      other.m_size._1_1_ = in_stack_fffffffffffffc91;
      other.m_size._0_1_ = in_stack_fffffffffffffc90;
      other.m_size._2_1_ = in_stack_fffffffffffffc92;
      other.m_size._3_1_ = in_stack_fffffffffffffc93;
      other.m_size._4_1_ = in_stack_fffffffffffffc94;
      other.m_size._5_1_ = in_stack_fffffffffffffc95;
      other.m_size._6_1_ = in_stack_fffffffffffffc96;
      other.m_size._7_1_ = in_stack_fffffffffffffc97;
      other.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
      iVar2 = QStringView::compare
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),other,
                         CaseInsensitive);
      QString::~QString((QString *)0x1aaf52);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(local_58,size,0);
        setElementClass(in_stack_fffffffffffffc70,
                        (QString *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        QString::~QString((QString *)0x1aaf8f);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)in_stack_fffffffffffffc88,
                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
        QStringView::QStringView<QString,_true>
                  ((QStringView *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                   (QString *)in_stack_fffffffffffffc78);
        other_00.m_size._1_1_ = in_stack_fffffffffffffc91;
        other_00.m_size._0_1_ = in_stack_fffffffffffffc90;
        other_00.m_size._2_1_ = in_stack_fffffffffffffc92;
        other_00.m_size._3_1_ = in_stack_fffffffffffffc93;
        other_00.m_size._4_1_ = in_stack_fffffffffffffc94;
        other_00.m_size._5_1_ = in_stack_fffffffffffffc95;
        other_00.m_size._6_1_ = in_stack_fffffffffffffc96;
        other_00.m_size._7_1_ = in_stack_fffffffffffffc97;
        other_00.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
        iVar2 = QStringView::compare
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),other_00,
                           CaseInsensitive);
        QString::~QString((QString *)0x1aaffa);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(local_98,size,0);
          setElementExtends(in_stack_fffffffffffffc70,
                            (QString *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                           );
          QString::~QString((QString *)0x1ab037);
        }
        else {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)in_stack_fffffffffffffc88,
                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
          QStringView::QStringView<QString,_true>
                    ((QStringView *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                     (QString *)in_stack_fffffffffffffc78);
          sVar3 = 0;
          other_01.m_size._1_1_ = in_stack_fffffffffffffc91;
          other_01.m_size._0_1_ = in_stack_fffffffffffffc90;
          other_01.m_size._2_1_ = in_stack_fffffffffffffc92;
          other_01.m_size._3_1_ = in_stack_fffffffffffffc93;
          other_01.m_size._4_1_ = in_stack_fffffffffffffc94;
          other_01.m_size._5_1_ = in_stack_fffffffffffffc95;
          other_01.m_size._6_1_ = in_stack_fffffffffffffc96;
          other_01.m_size._7_1_ = in_stack_fffffffffffffc97;
          other_01.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
          iVar2 = QStringView::compare
                            ((QStringView *)
                             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),other_01,
                             CaseInsensitive);
          QString::~QString((QString *)0x1ab0a2);
          if (iVar2 == 0) {
            this_00 = (DomHeader *)operator_new(0x38);
            memset(this_00,0,0x38);
            DomHeader::DomHeader((DomHeader *)in_stack_fffffffffffffc70);
            DomHeader::read(this_00,__fd,__buf_00,sVar3);
            setElementHeader((DomCustomWidget *)
                             CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                             (DomHeader *)in_stack_fffffffffffffc78);
          }
          else {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)in_stack_fffffffffffffc88,
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            QStringView::QStringView<QString,_true>
                      ((QStringView *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                       (QString *)in_stack_fffffffffffffc78);
            sVar3 = 0;
            other_02.m_size._1_1_ = in_stack_fffffffffffffc91;
            other_02.m_size._0_1_ = in_stack_fffffffffffffc90;
            other_02.m_size._2_1_ = in_stack_fffffffffffffc92;
            other_02.m_size._3_1_ = in_stack_fffffffffffffc93;
            other_02.m_size._4_1_ = in_stack_fffffffffffffc94;
            other_02.m_size._5_1_ = in_stack_fffffffffffffc95;
            other_02.m_size._6_1_ = in_stack_fffffffffffffc96;
            other_02.m_size._7_1_ = in_stack_fffffffffffffc97;
            other_02.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
            iVar2 = QStringView::compare
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                               other_02,CaseInsensitive);
            QString::~QString((QString *)0x1ab167);
            if (iVar2 == 0) {
              in_stack_fffffffffffffc98 = (DomSize *)operator_new(0xc);
              memset(in_stack_fffffffffffffc98,0,0xc);
              DomSize::DomSize(in_stack_fffffffffffffc98);
              DomSize::read(in_stack_fffffffffffffc98,__fd,__buf_01,sVar3);
              setElementSizeHint((DomCustomWidget *)
                                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                                 (DomSize *)in_stack_fffffffffffffc78);
            }
            else {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)in_stack_fffffffffffffc88,
                         CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
              QStringView::QStringView<QString,_true>
                        ((QStringView *)
                         CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         (QString *)in_stack_fffffffffffffc78);
              other_03.m_size._1_1_ = in_stack_fffffffffffffc91;
              other_03.m_size._0_1_ = in_stack_fffffffffffffc90;
              other_03.m_size._2_1_ = in_stack_fffffffffffffc92;
              other_03.m_size._3_1_ = in_stack_fffffffffffffc93;
              other_03.m_size._4_1_ = in_stack_fffffffffffffc94;
              other_03.m_size._5_1_ = in_stack_fffffffffffffc95;
              other_03.m_size._6_1_ = in_stack_fffffffffffffc96;
              other_03.m_size._7_1_ = in_stack_fffffffffffffc97;
              other_03.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
              iVar2 = QStringView::compare
                                ((QStringView *)
                                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                 other_03,CaseInsensitive);
              in_stack_fffffffffffffc97 = iVar2 != 0 ^ 0xff;
              QString::~QString((QString *)0x1ab22c);
              if ((in_stack_fffffffffffffc97 & 1) == 0) {
                Qt::Literals::StringLiterals::operator____s
                          ((char16_t *)in_stack_fffffffffffffc88,
                           CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
                QStringView::QStringView<QString,_true>
                          ((QStringView *)
                           CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                           (QString *)in_stack_fffffffffffffc78);
                other_04.m_size._1_1_ = in_stack_fffffffffffffc91;
                other_04.m_size._0_1_ = in_stack_fffffffffffffc90;
                other_04.m_size._2_1_ = in_stack_fffffffffffffc92;
                other_04.m_size._3_1_ = in_stack_fffffffffffffc93;
                other_04.m_size._4_1_ = in_stack_fffffffffffffc94;
                other_04.m_size._5_1_ = in_stack_fffffffffffffc95;
                other_04.m_size._6_1_ = in_stack_fffffffffffffc96;
                other_04.m_size._7_1_ = in_stack_fffffffffffffc97;
                other_04.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
                iVar2 = QStringView::compare
                                  ((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                   other_04,CaseInsensitive);
                in_stack_fffffffffffffc96 = iVar2 != 0 ^ 0xff;
                QString::~QString((QString *)0x1ab2d4);
                if ((in_stack_fffffffffffffc96 & 1) == 0) {
                  Qt::Literals::StringLiterals::operator____s
                            ((char16_t *)in_stack_fffffffffffffc88,
                             CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
                  QStringView::QStringView<QString,_true>
                            ((QStringView *)
                             CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                             (QString *)in_stack_fffffffffffffc78);
                  other_05.m_size._1_1_ = in_stack_fffffffffffffc91;
                  other_05.m_size._0_1_ = in_stack_fffffffffffffc90;
                  other_05.m_size._2_1_ = in_stack_fffffffffffffc92;
                  other_05.m_size._3_1_ = in_stack_fffffffffffffc93;
                  other_05.m_size._4_1_ = in_stack_fffffffffffffc94;
                  other_05.m_size._5_1_ = in_stack_fffffffffffffc95;
                  other_05.m_size._6_1_ = in_stack_fffffffffffffc96;
                  other_05.m_size._7_1_ = in_stack_fffffffffffffc97;
                  other_05.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
                  iVar2 = QStringView::compare
                                    ((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                     other_05,CaseInsensitive);
                  in_stack_fffffffffffffc95 = iVar2 != 0 ^ 0xff;
                  QString::~QString((QString *)0x1ab38c);
                  if ((in_stack_fffffffffffffc95 & 1) == 0) {
                    Qt::Literals::StringLiterals::operator____s
                              ((char16_t *)in_stack_fffffffffffffc88,
                               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
                    QStringView::QStringView<QString,_true>
                              ((QStringView *)
                               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                               (QString *)in_stack_fffffffffffffc78);
                    other_06.m_size._1_1_ = in_stack_fffffffffffffc91;
                    other_06.m_size._0_1_ = in_stack_fffffffffffffc90;
                    other_06.m_size._2_1_ = in_stack_fffffffffffffc92;
                    other_06.m_size._3_1_ = in_stack_fffffffffffffc93;
                    other_06.m_size._4_1_ = in_stack_fffffffffffffc94;
                    other_06.m_size._5_1_ = in_stack_fffffffffffffc95;
                    other_06.m_size._6_1_ = in_stack_fffffffffffffc96;
                    other_06.m_size._7_1_ = in_stack_fffffffffffffc97;
                    other_06.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
                    iVar2 = QStringView::compare
                                      ((QStringView *)
                                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                                       ,other_06,CaseInsensitive);
                    in_stack_fffffffffffffc94 = iVar2 != 0 ^ 0xff;
                    QString::~QString((QString *)0x1ab437);
                    if ((in_stack_fffffffffffffc94 & 1) == 0) {
                      Qt::Literals::StringLiterals::operator____s
                                ((char16_t *)in_stack_fffffffffffffc88,
                                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
                      QStringView::QStringView<QString,_true>
                                ((QStringView *)
                                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                                 (QString *)in_stack_fffffffffffffc78);
                      other_07.m_size._1_1_ = in_stack_fffffffffffffc91;
                      other_07.m_size._0_1_ = in_stack_fffffffffffffc90;
                      other_07.m_size._2_1_ = in_stack_fffffffffffffc92;
                      other_07.m_size._3_1_ = in_stack_fffffffffffffc93;
                      other_07.m_size._4_1_ = in_stack_fffffffffffffc94;
                      other_07.m_size._5_1_ = in_stack_fffffffffffffc95;
                      other_07.m_size._6_1_ = in_stack_fffffffffffffc96;
                      other_07.m_size._7_1_ = in_stack_fffffffffffffc97;
                      other_07.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
                      iVar2 = QStringView::compare
                                        ((QStringView *)
                                         CONCAT44(in_stack_fffffffffffffc6c,
                                                  in_stack_fffffffffffffc68),other_07,
                                         CaseInsensitive);
                      in_stack_fffffffffffffc93 = iVar2 != 0 ^ 0xff;
                      QString::~QString((QString *)0x1ab4df);
                      if ((in_stack_fffffffffffffc93 & 1) == 0) {
                        Qt::Literals::StringLiterals::operator____s
                                  ((char16_t *)in_stack_fffffffffffffc88,
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
                        QStringView::QStringView<QString,_true>
                                  ((QStringView *)
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                                   (QString *)in_stack_fffffffffffffc78);
                        other_08.m_size._1_1_ = in_stack_fffffffffffffc91;
                        other_08.m_size._0_1_ = in_stack_fffffffffffffc90;
                        other_08.m_size._2_1_ = in_stack_fffffffffffffc92;
                        other_08.m_size._3_1_ = in_stack_fffffffffffffc93;
                        other_08.m_size._4_1_ = in_stack_fffffffffffffc94;
                        other_08.m_size._5_1_ = in_stack_fffffffffffffc95;
                        other_08.m_size._6_1_ = in_stack_fffffffffffffc96;
                        other_08.m_size._7_1_ = in_stack_fffffffffffffc97;
                        other_08.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
                        iVar2 = QStringView::compare
                                          ((QStringView *)
                                           CONCAT44(in_stack_fffffffffffffc6c,
                                                    in_stack_fffffffffffffc68),other_08,
                                           CaseInsensitive);
                        in_stack_fffffffffffffc92 = iVar2 != 0 ^ 0xff;
                        QString::~QString((QString *)0x1ab58a);
                        if ((in_stack_fffffffffffffc92 & 1) == 0) {
                          Qt::Literals::StringLiterals::operator____s
                                    ((char16_t *)in_stack_fffffffffffffc88,
                                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
                          QStringView::QStringView<QString,_true>
                                    ((QStringView *)
                                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                                     (QString *)in_stack_fffffffffffffc78);
                          sVar3 = 0;
                          other_09.m_size._1_1_ = in_stack_fffffffffffffc91;
                          other_09.m_size._0_1_ = in_stack_fffffffffffffc90;
                          other_09.m_size._2_1_ = in_stack_fffffffffffffc92;
                          other_09.m_size._3_1_ = in_stack_fffffffffffffc93;
                          other_09.m_size._4_1_ = in_stack_fffffffffffffc94;
                          other_09.m_size._5_1_ = in_stack_fffffffffffffc95;
                          other_09.m_size._6_1_ = in_stack_fffffffffffffc96;
                          other_09.m_size._7_1_ = in_stack_fffffffffffffc97;
                          other_09.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
                          iVar2 = QStringView::compare
                                            ((QStringView *)
                                             CONCAT44(in_stack_fffffffffffffc6c,
                                                      in_stack_fffffffffffffc68),other_09,
                                             CaseInsensitive);
                          in_stack_fffffffffffffc91 = iVar2 != 0 ^ 0xff;
                          QString::~QString((QString *)0x1ab635);
                          if ((in_stack_fffffffffffffc91 & 1) == 0) {
                            Qt::Literals::StringLiterals::operator____s
                                      ((char16_t *)in_stack_fffffffffffffc88,
                                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80)
                                      );
                            QStringView::QStringView<QString,_true>
                                      ((QStringView *)
                                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80)
                                       ,(QString *)in_stack_fffffffffffffc78);
                            sVar3 = 0;
                            other_10.m_size._1_1_ = in_stack_fffffffffffffc91;
                            other_10.m_size._0_1_ = in_stack_fffffffffffffc90;
                            other_10.m_size._2_1_ = in_stack_fffffffffffffc92;
                            other_10.m_size._3_1_ = in_stack_fffffffffffffc93;
                            other_10.m_size._4_1_ = in_stack_fffffffffffffc94;
                            other_10.m_size._5_1_ = in_stack_fffffffffffffc95;
                            other_10.m_size._6_1_ = in_stack_fffffffffffffc96;
                            other_10.m_size._7_1_ = in_stack_fffffffffffffc97;
                            other_10.m_data = (storage_type_conflict *)in_stack_fffffffffffffc98;
                            iVar2 = QStringView::compare
                                              ((QStringView *)
                                               CONCAT44(in_stack_fffffffffffffc6c,
                                                        in_stack_fffffffffffffc68),other_10,
                                               CaseInsensitive);
                            in_stack_fffffffffffffc87 = iVar2 != 0 ^ 0xff;
                            QString::~QString((QString *)0x1ab6fa);
                            if ((in_stack_fffffffffffffc87 & 1) == 0) {
                              in_stack_fffffffffffffc70 = size;
                              Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffffc78,(size_t)size);
                              ::operator+((QLatin1String *)in_stack_fffffffffffffc70,
                                          (QStringView *)
                                          CONCAT44(in_stack_fffffffffffffc6c,
                                                   in_stack_fffffffffffffc68));
                              ::QStringBuilder::operator_cast_to_QString
                                        ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                                         CONCAT44(in_stack_fffffffffffffc6c,
                                                  in_stack_fffffffffffffc68));
                              QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffc70);
                              QString::~QString((QString *)0x1ab7d5);
                            }
                            else {
                              in_stack_fffffffffffffc78 = (DomSlots *)operator_new(0x38);
                              memset(in_stack_fffffffffffffc78,0,0x38);
                              DomPropertySpecifications::DomPropertySpecifications
                                        ((DomPropertySpecifications *)in_stack_fffffffffffffc70);
                              DomPropertySpecifications::read
                                        ((DomPropertySpecifications *)in_stack_fffffffffffffc78,__fd
                                         ,__buf_03,sVar3);
                              setElementPropertyspecifications
                                        ((DomCustomWidget *)
                                         CONCAT17(in_stack_fffffffffffffc87,
                                                  in_stack_fffffffffffffc80),
                                         (DomPropertySpecifications *)in_stack_fffffffffffffc78);
                            }
                          }
                          else {
                            in_stack_fffffffffffffc88 = (DomSlots *)operator_new(0x38);
                            memset(in_stack_fffffffffffffc88,0,0x38);
                            DomSlots::DomSlots((DomSlots *)in_stack_fffffffffffffc70);
                            DomSlots::read(in_stack_fffffffffffffc88,__fd,__buf_02,sVar3);
                            setElementSlots((DomCustomWidget *)
                                            CONCAT17(in_stack_fffffffffffffc87,
                                                     in_stack_fffffffffffffc80),
                                            in_stack_fffffffffffffc78);
                          }
                        }
                        else {
                          QMessageLogger::QMessageLogger
                                    ((QMessageLogger *)
                                     CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                                     (char *)in_stack_fffffffffffffc78,
                                     (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                                     (char *)CONCAT44(in_stack_fffffffffffffc6c,
                                                      in_stack_fffffffffffffc68));
                          QMessageLogger::warning
                                    (local_280,"Omitting deprecated element <properties>.");
                          QXmlStreamReader::skipCurrentElement();
                        }
                      }
                      else {
                        QMessageLogger::QMessageLogger
                                  ((QMessageLogger *)
                                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                                   (char *)in_stack_fffffffffffffc78,
                                   (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                                   (char *)CONCAT44(in_stack_fffffffffffffc6c,
                                                    in_stack_fffffffffffffc68));
                        QMessageLogger::warning(local_238,"Omitting deprecated element <script>.");
                        QXmlStreamReader::skipCurrentElement();
                      }
                    }
                    else {
                      QXmlStreamReader::readElementText(local_1f0,size,0);
                      setElementPixmap(in_stack_fffffffffffffc70,
                                       (QString *)
                                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                                      );
                      QString::~QString((QString *)0x1ab474);
                    }
                  }
                  else {
                    QMessageLogger::QMessageLogger
                              ((QMessageLogger *)
                               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                               (char *)in_stack_fffffffffffffc78,
                               (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                               (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                              );
                    QMessageLogger::warning(local_1b0,"Omitting deprecated element <sizepolicy>.");
                    QXmlStreamReader::skipCurrentElement();
                  }
                }
                else {
                  QXmlStreamReader::readElementText(local_168,size,0);
                  iVar2 = QString::toInt((QString *)in_stack_fffffffffffffc78,
                                         (bool *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c
                                        );
                  setElementContainer(this,iVar2);
                  QString::~QString((QString *)0x1ab321);
                }
              }
              else {
                QXmlStreamReader::readElementText(local_128,size,0);
                setElementAddPageMethod
                          (in_stack_fffffffffffffc70,
                           (QString *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
                ;
                QString::~QString((QString *)0x1ab269);
              }
            }
          }
        }
      }
    }
  } while (iVar2 != 5);
LAB_001ab7e0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomCustomWidget::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                setElementClass(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"extends"_s, Qt::CaseInsensitive)) {
                setElementExtends(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"header"_s, Qt::CaseInsensitive)) {
                auto *v = new DomHeader();
                v->read(reader);
                setElementHeader(v);
                continue;
            }
            if (!tag.compare(u"sizehint"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSize();
                v->read(reader);
                setElementSizeHint(v);
                continue;
            }
            if (!tag.compare(u"addpagemethod"_s, Qt::CaseInsensitive)) {
                setElementAddPageMethod(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"container"_s, Qt::CaseInsensitive)) {
                setElementContainer(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"sizepolicy"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <sizepolicy>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"pixmap"_s, Qt::CaseInsensitive)) {
                setElementPixmap(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"script"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <script>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"properties"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <properties>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"slots"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSlots();
                v->read(reader);
                setElementSlots(v);
                continue;
            }
            if (!tag.compare(u"propertyspecifications"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPropertySpecifications();
                v->read(reader);
                setElementPropertyspecifications(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}